

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *psVar1;
  uint uVar5;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  psVar1 = *argv;
  uVar5._0_2_ = psVar1->flags;
  uVar5._2_1_ = psVar1->enc;
  uVar5._3_1_ = psVar1->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
    if ((context->pMem->flags & 0x2000) == 0) {
      pcVar4 = (char *)createAggContext(context,0x20);
    }
    else {
      pcVar4 = context->pMem->z;
    }
    if (pcVar4 != (char *)0x0) {
      iVar3 = 1;
      iVar2 = sqlite3ValueBytes(*argv,'\x01');
      if (argc == 2) {
        iVar3 = sqlite3ValueBytes(argv[1],'\x01');
      }
      iVar3 = iVar3 + iVar2;
      uVar5 = *(int *)(pcVar4 + 0x18) - iVar3;
      if (uVar5 == 0 || *(int *)(pcVar4 + 0x18) < iVar3) {
        pcVar4[0x18] = '\0';
        pcVar4[0x19] = '\0';
        pcVar4[0x1a] = '\0';
        pcVar4[0x1b] = '\0';
      }
      else {
        *(uint *)(pcVar4 + 0x18) = uVar5;
        memmove(*(void **)(pcVar4 + 8),(void *)((long)iVar3 + (long)*(void **)(pcVar4 + 8)),
                (ulong)uVar5);
      }
      if (*(int *)(pcVar4 + 0x18) == 0) {
        pcVar4[0x14] = '\0';
        pcVar4[0x15] = '\0';
        pcVar4[0x16] = '\0';
        pcVar4[0x17] = '\0';
      }
    }
  }
  return;
}

Assistant:

static void groupConcatInverse(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  StrAccum *pAccum;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pAccum = (StrAccum*)sqlite3_aggregate_context(context, sizeof(*pAccum));
  /* pAccum is always non-NULL since groupConcatStep() will have always
  ** run frist to initialize it */
  if( ALWAYS(pAccum) ){
    n = sqlite3_value_bytes(argv[0]);
    if( argc==2 ){
      n += sqlite3_value_bytes(argv[1]);
    }else{
      n++;
    }
    if( n>=(int)pAccum->nChar ){
      pAccum->nChar = 0;
    }else{
      pAccum->nChar -= n;
      memmove(pAccum->zText, &pAccum->zText[n], pAccum->nChar);
    }
    if( pAccum->nChar==0 ) pAccum->mxAlloc = 0;
  }
}